

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O1

void __thiscall GGSock::Communicator::Data::~Data(Data *this)

{
  long *plVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  long *plVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  this->isListening = false;
  this->isConnected = false;
  this->isConnecting = false;
  this->isRunning = false;
  anon_unknown.dwarf_783c::closeAndReset(&this->sdpeer);
  anon_unknown.dwarf_783c::closeAndReset(&this->sd);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  if ((this->worker)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
  ::~_Rb_tree(&(this->messageCallback)._M_t);
  p_Var2 = (this->errorCallback).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->errorCallback,(_Any_data *)&this->errorCallback,__destroy_functor)
    ;
  }
  if ((this->worker)._M_id._M_thread == 0) {
    pcVar3 = (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar3 != (pointer)0x0) {
      operator_delete(pcVar3,(long)(this->bufferDataRecv).
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
    }
    lVar6 = 0x1158;
    do {
      plVar1 = (long *)((long)&((Data *)(&((Data *)(&((Data *)(&this->addr + -3))->addr + -3))->addr
                                        + -3))->addr + lVar6 + 0xffffffffffffffd0U);
      plVar4 = *(long **)((long)(&this->addr + -4) + lVar6);
      if (plVar1 != plVar4) {
        operator_delete(plVar4,*plVar1 + 1);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0x158);
    return;
  }
  std::terminate();
}

Assistant:

~Data() {
            {
                std::lock_guard<std::mutex> lock(mutex);
                isRunning = false;
                isConnected = false;
                isConnecting = false;
                isListening = false;
                ::closeAndReset(sdpeer);
                ::closeAndReset(sd);
            }

            if (worker.joinable()) {
                worker.join();
            }
        }